

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

presentation_type fmt::v9::detail::parse_presentation_type<char>(char type)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,type);
  switch(iVar1) {
  case 0x61:
    return hexfloat_lower;
  case 0x62:
    return bin_lower;
  case 99:
    return chr;
  case 100:
    return dec;
  case 0x65:
    return exp_lower;
  case 0x66:
    return fixed_lower;
  case 0x67:
    return general_lower;
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
    goto switchD_00125cd2_caseD_68;
  case 0x6f:
    return oct;
  case 0x70:
    return pointer;
  case 0x73:
    return string;
  case 0x78:
    return hex_lower;
  default:
    switch(iVar1) {
    case 0x3f:
      return debug;
    case 0x40:
    case 0x43:
    case 0x44:
      break;
    case 0x41:
      return hexfloat_upper;
    case 0x42:
      return bin_upper;
    case 0x45:
      return exp_upper;
    case 0x46:
      return fixed_upper;
    case 0x47:
      return general_upper;
    default:
      if (iVar1 == 0x58) {
        return hex_upper;
      }
    }
switchD_00125cd2_caseD_68:
    return none;
  }
}

Assistant:

FMT_CONSTEXPR auto parse_presentation_type(Char type) -> presentation_type {
  switch (to_ascii(type)) {
  case 'd':
    return presentation_type::dec;
  case 'o':
    return presentation_type::oct;
  case 'x':
    return presentation_type::hex_lower;
  case 'X':
    return presentation_type::hex_upper;
  case 'b':
    return presentation_type::bin_lower;
  case 'B':
    return presentation_type::bin_upper;
  case 'a':
    return presentation_type::hexfloat_lower;
  case 'A':
    return presentation_type::hexfloat_upper;
  case 'e':
    return presentation_type::exp_lower;
  case 'E':
    return presentation_type::exp_upper;
  case 'f':
    return presentation_type::fixed_lower;
  case 'F':
    return presentation_type::fixed_upper;
  case 'g':
    return presentation_type::general_lower;
  case 'G':
    return presentation_type::general_upper;
  case 'c':
    return presentation_type::chr;
  case 's':
    return presentation_type::string;
  case 'p':
    return presentation_type::pointer;
  case '?':
    return presentation_type::debug;
  default:
    return presentation_type::none;
  }
}